

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsCreators.cpp
# Opt level: O2

void chrono::utils::AddTorusGeometry
               (ChBody *body,shared_ptr<chrono::ChMaterialSurface> *material,double radius,
               double thickness,int segments,int angle,ChVector<double> *pos,
               ChQuaternion<double> *rot,bool visualization,
               shared_ptr<chrono::ChVisualMaterial> *vis_material)

{
  undefined1 auVar1 [16];
  int iVar2;
  undefined1 auVar3 [16];
  double __x;
  double dVar4;
  ChVector<double> v;
  Quaternion q;
  __shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2> local_c8;
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> local_b8;
  double local_a8;
  undefined8 uStack_a0;
  ChQuaternion<double> local_98;
  ChQuaternion<double> local_70;
  ChQuaternion<double> local_50;
  
  for (iVar2 = 0; iVar2 < angle; iVar2 = iVar2 + angle / segments) {
    __x = ((double)iVar2 * 3.141592653589793) / 180.0;
    local_a8 = cos(__x);
    local_a8 = local_a8 * radius;
    uStack_a0 = 0;
    dVar4 = sin(__x);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = __x;
    auVar3._8_8_ = 0x8000000000000000;
    auVar3._0_8_ = 0x8000000000000000;
    auVar3 = vxorpd_avx512vl(auVar1,auVar3);
    Q_from_AngAxis(&local_98,auVar3._0_8_,(ChVector<double> *)&VECT_Y);
    Q_from_AngAxis(&local_70,1.5707963267948966,(ChVector<double> *)&VECT_X);
    ChQuaternion<double>::operator%(&local_50,&local_98,&local_70);
    std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_b8,
               &material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)
    ;
    local_98.m_data[0] = local_a8 + pos->m_data[0];
    local_98.m_data[1] = pos->m_data[1] + 0.0;
    local_98.m_data[2] = dVar4 * radius + pos->m_data[2];
    std::__shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_c8,
               &vis_material->
                super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>);
    AddCapsuleGeometry(body,(shared_ptr<chrono::ChMaterialSurface> *)&local_b8,thickness,
                       (((radius + thickness) * 6.283185307179586) / (double)segments) * 0.5,
                       (ChVector<double> *)&local_98,&local_50,visualization,
                       (shared_ptr<chrono::ChVisualMaterial> *)&local_c8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c8._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8._M_refcount);
  }
  return;
}

Assistant:

void AddTorusGeometry(ChBody* body,
                      std::shared_ptr<ChMaterialSurface> material,
                      double radius,
                      double thickness,
                      int segments,
                      int angle,
                      const ChVector<>& pos,
                      const ChQuaternion<>& rot,
                      bool visualization,
                      std::shared_ptr<ChVisualMaterial> vis_material) {
    for (int i = 0; i < angle; i += angle / segments) {
        double alpha = i * CH_C_PI / 180.0;
        double x = cos(alpha) * radius;
        double z = sin(alpha) * radius;
        Quaternion q = chrono::Q_from_AngAxis(-alpha, VECT_Y) % chrono::Q_from_AngAxis(CH_C_PI / 2.0, VECT_X);
        double outer_circ = 2 * CH_C_PI * (radius + thickness);

        AddCapsuleGeometry(body, material, thickness, outer_circ / segments * .5, ChVector<>(x, 0, z) + pos, q,
                           visualization, vis_material);
    }
}